

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedResourceSignatureImpl.hpp
# Opt level: O0

SerializedData * __thiscall
Diligent::SerializedResourceSignatureImpl::GetDeviceData
          (SerializedResourceSignatureImpl *this,DeviceType Type)

{
  bool bVar1;
  Char *Message;
  unique_ptr *this_00;
  pointer pPVar2;
  char (*in_RCX) [40];
  SerializedData *local_68;
  value_type *Wrpr;
  undefined1 local_38 [8];
  string msg;
  DeviceType Type_local;
  SerializedResourceSignatureImpl *this_local;
  
  msg.field_2._12_4_ = Type;
  if (WebGPU < Type) {
    FormatString<char[26],char[40]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"static_cast<Uint32>(Type) < DeviceCount",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetDeviceData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/include/SerializedResourceSignatureImpl.hpp"
               ,0x60);
    std::__cxx11::string::~string((string *)local_38);
  }
  this_00 = (unique_ptr *)
            std::
            array<std::unique_ptr<Diligent::SerializedResourceSignatureImpl::PRSWapperBase,_std::default_delete<Diligent::SerializedResourceSignatureImpl::PRSWapperBase>_>,_7UL>
            ::operator[](&this->m_pDeviceSignatures,(ulong)(uint)msg.field_2._12_4_);
  bVar1 = std::unique_ptr::operator_cast_to_bool(this_00);
  if (bVar1) {
    pPVar2 = std::
             unique_ptr<Diligent::SerializedResourceSignatureImpl::PRSWapperBase,_std::default_delete<Diligent::SerializedResourceSignatureImpl::PRSWapperBase>_>
             ::operator->((unique_ptr<Diligent::SerializedResourceSignatureImpl::PRSWapperBase,_std::default_delete<Diligent::SerializedResourceSignatureImpl::PRSWapperBase>_>
                           *)this_00);
    local_68 = &pPVar2->Data;
  }
  else {
    local_68 = (SerializedData *)0x0;
  }
  return local_68;
}

Assistant:

const SerializedData* GetDeviceData(DeviceType Type) const
    {
        VERIFY_EXPR(static_cast<Uint32>(Type) < DeviceCount);
        const auto& Wrpr = m_pDeviceSignatures[static_cast<size_t>(Type)];
        return Wrpr ? &Wrpr->Data : nullptr;
    }